

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O0

deUint32 roundToNearestEven(deUint32 val,deUint32 numBitsToDiscard)

{
  uint uVar1;
  byte bVar2;
  deUint32 headBit;
  deUint32 lastBits;
  deUint32 numBitsToDiscard_local;
  deUint32 val_local;
  
  bVar2 = (byte)numBitsToDiscard;
  uVar1 = val & 1 << (bVar2 - 1 & 0x1f);
  numBitsToDiscard_local = val >> (bVar2 & 0x1f);
  if (uVar1 != 0) {
    if (uVar1 == (val & (1 << (bVar2 & 0x1f)) - 1U)) {
      if ((numBitsToDiscard_local & 1) == 1) {
        numBitsToDiscard_local = numBitsToDiscard_local + 1;
      }
    }
    else {
      numBitsToDiscard_local = numBitsToDiscard_local + 1;
    }
  }
  return numBitsToDiscard_local;
}

Assistant:

static deUint32 roundToNearestEven (deUint32 val, const deUint32 numBitsToDiscard)
{
	const deUint32	lastBits	= val & ((1 << numBitsToDiscard) - 1);
	const deUint32	headBit		= val & (1 << (numBitsToDiscard - 1));

	DE_ASSERT(numBitsToDiscard > 0 && numBitsToDiscard < 32);	/* Make sure no overflow. */
	val >>= numBitsToDiscard;

	if (headBit == 0)
	{
		return val;
	}
	else if (headBit == lastBits)
	{
		if ((val & 0x1) == 0x1)
		{
			return val + 1;
		}
		else
		{
			return val;
		}
	}
	else
	{
		return val + 1;
	}
}